

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::ruby::Generator::Generate
          (Generator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  Syntax SVar1;
  int iVar2;
  string *proto_file;
  undefined4 extraout_var;
  ZeroCopyOutputStream *output_00;
  undefined1 local_f8 [8];
  Printer printer;
  string local_60;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> local_40;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> output;
  string *error_local;
  GeneratorContext *generator_context_local;
  string *parameter_local;
  FileDescriptor *file_local;
  Generator *this_local;
  
  output.ptr_ = (ZeroCopyOutputStream *)error;
  SVar1 = FileDescriptor::syntax(file);
  if (SVar1 == SYNTAX_PROTO3) {
    proto_file = FileDescriptor::name_abi_cxx11_(file);
    GetOutputFilename(&local_60,proto_file);
    iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_60);
    internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
              (&local_40,(ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2));
    std::__cxx11::string::~string((string *)&local_60);
    output_00 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get(&local_40);
    io::Printer::Printer((Printer *)local_f8,output_00,'$');
    this_local._7_1_ = GenerateFile(file,(Printer *)local_f8,(string *)output.ptr_);
    io::Printer::~Printer((Printer *)local_f8);
    internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr(&local_40);
  }
  else {
    std::__cxx11::string::operator=
              ((string *)output.ptr_,
               "Can only generate Ruby code for proto3 .proto files.\nPlease add \'syntax = \"proto3\";\' to the top of your .proto file.\n"
              );
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Generator::Generate(
    const FileDescriptor* file,
    const string& parameter,
    GeneratorContext* generator_context,
    string* error) const {

  if (file->syntax() != FileDescriptor::SYNTAX_PROTO3) {
    *error =
        "Can only generate Ruby code for proto3 .proto files.\n"
        "Please add 'syntax = \"proto3\";' to the top of your .proto file.\n";
    return false;
  }

  scoped_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(GetOutputFilename(file->name())));
  io::Printer printer(output.get(), '$');

  return GenerateFile(file, &printer, error);
}